

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::bofFixup(RBBITableBuilder *this)

{
  RBBINode *pRVar1;
  UVector *this_00;
  UBool UVar2;
  int32_t iVar3;
  int *piVar4;
  int local_2c;
  int startNodeIx;
  RBBINode *startNode;
  UVector *matchStartNodes;
  RBBINode *bofNode;
  RBBITableBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*this->fStatus);
  if (UVar2 == '\0') {
    pRVar1 = (*this->fTree)->fLeftChild->fLeftChild;
    this_00 = (*this->fTree)->fLeftChild->fRightChild->fFirstPosSet;
    for (local_2c = 0; iVar3 = UVector::size(this_00), local_2c < iVar3; local_2c = local_2c + 1) {
      piVar4 = (int *)UVector::elementAt(this_00,local_2c);
      if ((*piVar4 == 3) && (piVar4[0x1f] == pRVar1->fVal)) {
        setAdd(this,pRVar1->fFollowPos,*(UVector **)(piVar4 + 0x26));
      }
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::bofFixup() {

    if (U_FAILURE(*fStatus)) {
        return;
    }

    //   The parse tree looks like this ...
    //         fTree root  --->       <cat>
    //                               /     \       .
    //                            <cat>   <#end node>
    //                           /     \  .
    //                     <bofNode>   rest
    //                               of tree
    //
    //    We will be adding things to the followPos set of the <bofNode>
    //
    RBBINode  *bofNode = fTree->fLeftChild->fLeftChild;
    U_ASSERT(bofNode->fType == RBBINode::leafChar);
    U_ASSERT(bofNode->fVal == 2);

    // Get all nodes that can be the start a match of the user-written rules
    //  (excluding the fake bofNode)
    //  We want the nodes that can start a match in the
    //     part labeled "rest of tree"
    // 
    UVector *matchStartNodes = fTree->fLeftChild->fRightChild->fFirstPosSet;

    RBBINode *startNode;
    int       startNodeIx;
    for (startNodeIx = 0; startNodeIx<matchStartNodes->size(); startNodeIx++) {
        startNode = (RBBINode *)matchStartNodes->elementAt(startNodeIx);
        if (startNode->fType != RBBINode::leafChar) {
            continue;
        }

        if (startNode->fVal == bofNode->fVal) {
            //  We found a leaf node corresponding to a {bof} that was
            //    explicitly written into a rule.
            //  Add everything from the followPos set of this node to the
            //    followPos set of the fake bofNode at the start of the tree.
            //  
            setAdd(bofNode->fFollowPos, startNode->fFollowPos);
        }
    }
}